

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t b_find_prev_key(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ion_bpp_err_t iVar1;
  ion_bpp_h_node_t *h;
  ion_bpp_buffer_t *buf;
  ion_bpp_key_t *fkey;
  ion_bpp_key_t *pkey;
  ion_bpp_external_address_t *piStack_28;
  ion_bpp_err_t rc;
  ion_bpp_external_address_t *rec_local;
  void *key_local;
  ion_bpp_handle_t handle_local;
  
  h = *(ion_bpp_h_node_t **)((long)handle + 0xa8);
  if (h == (ion_bpp_h_node_t *)0x0) {
    return bErrKeyNotFound;
  }
  buf = (ion_bpp_buffer_t *)(h->comp + 0x20);
  piStack_28 = rec;
  rec_local = (ion_bpp_external_address_t *)key;
  key_local = handle;
  if (*(ion_bpp_buffer_t **)((long)handle + 0xb0) == buf) {
    if (*(long *)(h->comp + 8) == 0) {
      return bErrKeyNotFound;
    }
    iVar1 = readDisk(handle,*(ion_bpp_address_t *)(h->comp + 8),(ion_bpp_buffer_t **)&h);
    if (iVar1 != bErrOk) {
      return iVar1;
    }
    fkey = (ion_bpp_key_t *)
           (h->comp +
           (long)(int)(((*(ushort *)h->comp >> 1) - 1) * *(int *)((long)handle + 0xbc)) + 0x20);
    pkey._4_4_ = 0;
  }
  else {
    fkey = (ion_bpp_key_t *)(*(long *)((long)handle + 0xb0) - (long)*(int *)((long)handle + 0xbc));
  }
  memcpy(rec_local,fkey,(long)*(int *)((long)handle + 8));
  *piStack_28 = *(ion_bpp_external_address_t *)(fkey + *(int *)((long)handle + 8));
  *(ion_bpp_h_node_t **)((long)handle + 0xa8) = h;
  *(ion_bpp_key_t **)((long)handle + 0xb0) = fkey;
  return bErrOk;
}

Assistant:

ion_bpp_err_t
b_find_prev_key(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_key_t		*pkey;			/* previous key */
	ion_bpp_key_t		*fkey;			/* first key */
	ion_bpp_buffer_t	*buf;				/* buffer */

	ion_bpp_h_node_t *h = handle;

	if ((buf = h->curBuf) == NULL) {
		return bErrKeyNotFound;
	}

	fkey = fkey(buf);

	if (h->curKey == fkey) {
		/* current key is first key in leaf node */
		if (prev(buf)) {
			/* fetch previous set */
			if ((rc = readDisk(handle, prev(buf), &buf)) != 0) {
				return rc;
			}

			pkey = fkey(buf) + ks((ct(buf) - 1));
		}
		else {
			/* no more sets */
			return bErrKeyNotFound;
		}
	}
	else {
		/* bump to previous key */
		pkey = h->curKey - ks(1);
	}

	memcpy(key, key(pkey), h->keySize);
	*rec		= rec(pkey);
	h->curBuf	= buf;
	h->curKey	= pkey;
	return bErrOk;
}